

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proj.c
# Opt level: O1

void project_normalcone(OSQPWorkspace *work,c_float *z,c_float *y)

{
  OSQPData *pOVar1;
  long lVar2;
  c_float *pcVar3;
  c_float *pcVar4;
  c_float *pcVar5;
  long lVar6;
  double dVar7;
  
  pOVar1 = work->data;
  lVar2 = pOVar1->m;
  if (0 < lVar2) {
    pcVar3 = work->z_prev;
    pcVar4 = pOVar1->l;
    pcVar5 = pOVar1->u;
    lVar6 = 0;
    do {
      dVar7 = z[lVar6] + y[lVar6];
      pcVar3[lVar6] = dVar7;
      if (dVar7 <= pcVar4[lVar6]) {
        dVar7 = pcVar4[lVar6];
      }
      if (pcVar5[lVar6] <= dVar7) {
        dVar7 = pcVar5[lVar6];
      }
      z[lVar6] = dVar7;
      y[lVar6] = pcVar3[lVar6] - dVar7;
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
  }
  return;
}

Assistant:

void project_normalcone(OSQPWorkspace *work, c_float *z, c_float *y) {
  c_int i, m;

  // NB: Use z_prev as temporary vector

  m = work->data->m;

  for (i = 0; i < m; i++) {
    work->z_prev[i] = z[i] + y[i];
    z[i]            = c_min(c_max(work->z_prev[i], work->data->l[i]),
                            work->data->u[i]);
    y[i] = work->z_prev[i] - z[i];
  }
}